

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_in_rewind(Curl_easy *data,Curl_creader *reader)

{
  uint uVar1;
  curlioerr cVar2;
  uint *puVar3;
  int err_2;
  curlioerr err_1;
  int err;
  cr_in_ctx *ctx;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  if ((*(byte *)((long)reader->ctx + 0x44) >> 2 & 1) == 0) {
    return CURLE_OK;
  }
  if ((data->set).seek_func == (curl_seek_callback)0x0) {
    if ((data->set).ioctl_func == (curl_ioctl_callback)0x0) {
      if ((data->state).fread_func == fread) {
        uVar1 = fseek((FILE *)(data->state).in,0,0);
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_read.log_level)) {
          puVar3 = (uint *)__errno_location();
          Curl_trc_read(data,"cr_in, rewind via fseek -> %d(%d)",(ulong)uVar1,(ulong)*puVar3);
        }
        if (uVar1 != 0xffffffff) {
          return CURLE_OK;
        }
      }
      Curl_failf(data,"necessary data rewind was not possible");
      return CURLE_SEND_FAIL_REWIND;
    }
    Curl_set_in_callback(data,true);
    cVar2 = (*(data->set).ioctl_func)(data,1,(data->set).ioctl_client);
    Curl_set_in_callback(data,false);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_in, rewind via set.ioctl_func -> %d",(ulong)cVar2);
    }
    if (cVar2 != CURLIOE_OK) {
      Curl_failf(data,"ioctl callback returned error %d",(ulong)cVar2);
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else {
    Curl_set_in_callback(data,true);
    uVar1 = (*(data->set).seek_func)((data->set).seek_client,0,0);
    Curl_set_in_callback(data,false);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_in, rewind via set.seek_func -> %d",(ulong)uVar1);
    }
    if (uVar1 != 0) {
      Curl_failf(data,"seek callback returned error %d",(ulong)uVar1);
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_in_rewind(struct Curl_easy *data,
                             struct Curl_creader *reader)
{
  struct cr_in_ctx *ctx = reader->ctx;

  /* If we never invoked the callback, there is noting to rewind */
  if(!ctx->has_used_cb)
    return CURLE_OK;

  if(data->set.seek_func) {
    int err;

    Curl_set_in_callback(data, true);
    err = (data->set.seek_func)(data->set.seek_client, 0, SEEK_SET);
    Curl_set_in_callback(data, false);
    CURL_TRC_READ(data, "cr_in, rewind via set.seek_func -> %d", err);
    if(err) {
      failf(data, "seek callback returned error %d", (int)err);
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else if(data->set.ioctl_func) {
    curlioerr err;

    Curl_set_in_callback(data, true);
    err = (data->set.ioctl_func)(data, CURLIOCMD_RESTARTREAD,
                                 data->set.ioctl_client);
    Curl_set_in_callback(data, false);
    CURL_TRC_READ(data, "cr_in, rewind via set.ioctl_func -> %d", (int)err);
    if(err) {
      failf(data, "ioctl callback returned error %d", (int)err);
      return CURLE_SEND_FAIL_REWIND;
    }
  }
  else {
    /* If no CURLOPT_READFUNCTION is used, we know that we operate on a
       given FILE * stream and we can actually attempt to rewind that
       ourselves with fseek() */
    if(data->state.fread_func == (curl_read_callback)fread) {
      int err = fseek(data->state.in, 0, SEEK_SET);
      CURL_TRC_READ(data, "cr_in, rewind via fseek -> %d(%d)",
                    (int)err, (int)errno);
      if(-1 != err)
        /* successful rewind */
        return CURLE_OK;
    }

    /* no callback set or failure above, makes us fail at once */
    failf(data, "necessary data rewind was not possible");
    return CURLE_SEND_FAIL_REWIND;
  }
  return CURLE_OK;
}